

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProductionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProductionSyntax,slang::syntax::DataTypeSyntax*&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,DataTypeSyntax **args,Token *args_1,FunctionPortListSyntax **args_2,
          Token *args_3,SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *args_4,Token *args_5)

{
  Token semi;
  Token name;
  Token colon;
  ProductionSyntax *pPVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  ProductionSyntax *in_R9;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pPVar1 = (ProductionSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  name.info = in_RCX;
  name.kind = (short)in_R8;
  name._2_1_ = (char)((ulong)in_R8 >> 0x10);
  name.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  name.rawLen = (int)((ulong)in_R8 >> 0x20);
  colon.info = in_RDI;
  colon.kind = (short)in_RSI;
  colon._2_1_ = (char)((ulong)in_RSI >> 0x10);
  colon.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  colon.rawLen = (int)((ulong)in_RSI >> 0x20);
  semi.info = in_stack_00000008;
  semi.kind = (short)unaff_retaddr;
  semi._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  semi.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  semi.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::ProductionSyntax::ProductionSyntax
            (in_R9,(DataTypeSyntax *)in_RDX[1],name,(FunctionPortListSyntax *)*in_RDX,colon,
             *(SeparatedSyntaxList<slang::syntax::RsRuleSyntax> **)(in_R8 + 8),semi);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }